

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TablePopBackgroundChannel(void)

{
  int iVar1;
  ImGuiWindow *window;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  
  window = GImGui->CurrentWindow;
  pIVar2 = GImGui->CurrentTable;
  iVar1 = pIVar2->CurrentColumn;
  pIVar3 = (pIVar2->Columns).Data;
  SetWindowClipRectBeforeSetChannel(window,&pIVar2->HostBackupInnerClipRect);
  ImDrawListSplitter::SetCurrentChannel
            (&pIVar2->DrawSplitter,window->DrawList,(uint)pIVar3[iVar1].DrawChannelCurrent);
  return;
}

Assistant:

void ImGui::TablePopBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupInnerClipRect);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}